

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

datetime * __thiscall cppcms::filters::datetime::operator=(datetime *this,datetime *other)

{
  streamable *in_RSI;
  datetime *in_RDI;
  
  streamable::operator=(in_RSI,&in_RDI->time_);
  std::__cxx11::string::operator=((string *)&in_RDI->tz_,(string *)(in_RSI + 1));
  return in_RDI;
}

Assistant:

datetime const &datetime::operator=(datetime const &other) { time_=other.time_; tz_ = other.tz_; return *this; }